

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_CCtx_params params;
  ZSTD_CDict *cdict;
  ZSTD_CDict *pZVar1;
  size_t sVar2;
  ZSTD_strategy ZVar3;
  long lVar4;
  void *pvVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  void *alloc;
  byte bVar8;
  ZSTD_compressionParameters cParams;
  ZSTD_allocFunction in_stack_fffffffffffffe28;
  ZSTD_freeFunction in_stack_fffffffffffffe30;
  void *in_stack_fffffffffffffe38;
  undefined1 auVar9 [12];
  undefined1 auVar10 [24];
  undefined1 in_stack_fffffffffffffe40 [152];
  undefined1 auVar11 [24];
  ZSTD_compressionParameters local_128;
  ZSTD_allocFunction local_108;
  ZSTD_freeFunction p_Stack_100;
  void *local_f8;
  void *local_e8;
  ZSTD_CCtx_params local_e0;
  
  bVar8 = 0;
  memcpy(&local_e0,originalCctxParams,0xb0);
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (local_e0.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                (&local_128,&local_e0,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      local_e0.cParams.windowLog = local_128.windowLog;
      local_e0.cParams.chainLog = local_128.chainLog;
      local_e0.cParams.hashLog = local_128.hashLog;
      local_e0.cParams.searchLog = local_128.searchLog;
      local_e0.cParams.minMatch = local_128.minMatch;
      local_e0.cParams.targetLength = local_128.targetLength;
      ZVar3 = local_128.strategy;
    }
    else {
      ZSTD_getCParams_internal(&local_128,local_e0.compressionLevel,0,dictSize,ZSTD_cpm_createCDict)
      ;
      if (local_128.strategy - ZSTD_greedy < 3) {
        local_128.hashLog = local_128.hashLog + 2;
      }
      if (local_e0.cParams.windowLog == 0) {
        local_e0.cParams.windowLog = local_128.windowLog;
      }
      if (local_e0.cParams.hashLog == 0) {
        local_e0.cParams.hashLog = local_128.hashLog;
      }
      if (local_e0.cParams.chainLog == 0) {
        local_e0.cParams.chainLog = local_128.chainLog;
      }
      if (local_e0.cParams.searchLog == 0) {
        local_e0.cParams.searchLog = local_128.searchLog;
      }
      if (local_e0.cParams.minMatch == 0) {
        local_e0.cParams.minMatch = local_128.minMatch;
      }
      if (local_e0.cParams.targetLength == 0) {
        local_e0.cParams.targetLength = local_128.targetLength;
      }
      ZVar3 = local_128.strategy;
      if (local_e0.cParams.strategy != 0) {
        ZVar3 = local_e0.cParams.strategy;
      }
    }
    local_e8 = dict;
    if (((ZVar3 - ZSTD_btlazy2 < 0xfffffffd) ||
        (local_e0.cParams.hashLog <= local_e0.cParams.chainLog)) ||
       (0x18 < local_e0.cParams.chainLog)) {
      local_e0.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                (&local_128,&local_e0,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      local_e0.cParams.windowLog = local_128.windowLog;
      local_e0.cParams.chainLog = local_128.chainLog;
      local_e0.cParams.hashLog = local_128.hashLog;
      local_e0.cParams.searchLog = local_128.searchLog;
      local_e0.cParams.minMatch = local_128.minMatch;
      local_e0.cParams.targetLength = local_128.targetLength;
      ZVar3 = local_128.strategy;
    }
    local_e0.cParams.strategy = ZVar3;
    useRowMatchFinder = local_e0.useRowMatchFinder;
    if ((local_e0.useRowMatchFinder == ZSTD_urm_auto) &&
       (useRowMatchFinder = ZSTD_urm_disableRowMatchFinder, 0xfffffffc < ZVar3 - ZSTD_btlazy2)) {
      useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (local_e0.cParams.windowLog < 0xf);
    }
    local_e0.useRowMatchFinder = useRowMatchFinder;
    local_108 = customMem.customAlloc;
    p_Stack_100 = customMem.customFree;
    local_f8 = customMem.opaque;
    local_128.hashLog = local_e0.cParams.hashLog;
    if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
        (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
      sVar2 = ZSTD_sizeof_matchState
                        (&local_128,useRowMatchFinder,local_e0.enableDedicatedDictSearch,0);
      lVar4 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2c90;
      if (dictLoadMethod == ZSTD_dlm_byRef) {
        lVar4 = 0x2c90;
      }
      cdict = (ZSTD_CDict *)ZSTD_customMalloc(lVar4 + sVar2,customMem);
      if (cdict == (ZSTD_CDict *)0x0) {
        cdict = (ZSTD_CDict *)0x0;
        customMem_00.customFree = p_Stack_100;
        customMem_00.customAlloc = local_108;
        customMem_00.opaque = local_f8;
        customMem.customAlloc = local_108;
        customMem.customFree = p_Stack_100;
        customMem.opaque = local_f8;
        ZSTD_customFree((void *)0x0,customMem_00);
      }
      else {
        pvVar5 = (void *)((long)&cdict->dictContent + lVar4 + sVar2);
        pZVar1 = cdict + 1;
        (cdict->workspace).workspace = cdict;
        (cdict->workspace).workspaceEnd = pvVar5;
        (cdict->workspace).objectEnd = pZVar1;
        (cdict->workspace).tableEnd = pZVar1;
        (cdict->workspace).tableValidEnd = pZVar1;
        (cdict->workspace).allocStart = pvVar5;
        (cdict->workspace).allocFailed = '\0';
        (cdict->workspace).workspaceOversizedDuration = 0;
        (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
        (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
        (cdict->customMem).customAlloc = local_108;
        (cdict->customMem).customFree = p_Stack_100;
        (cdict->customMem).opaque = local_f8;
        cdict->compressionLevel = 0;
        cdict->useRowMatchFinder = useRowMatchFinder;
      }
    }
    else {
      cdict = (ZSTD_CDict *)0x0;
      customMem.customAlloc = in_stack_fffffffffffffe28;
      customMem.customFree = in_stack_fffffffffffffe30;
      customMem.opaque = in_stack_fffffffffffffe38;
    }
    pZVar6 = &local_e0;
    puVar7 = (undefined8 *)&stack0xfffffffffffffe28;
    for (lVar4 = 0x16; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *(undefined8 *)pZVar6;
      pZVar6 = (ZSTD_CCtx_params *)((long)pZVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    params.cParams._4_8_ = customMem.customFree;
    params._0_8_ = customMem.customAlloc;
    params.cParams._12_8_ = customMem.opaque;
    auVar9 = in_stack_fffffffffffffe40._8_12_;
    auVar10 = in_stack_fffffffffffffe40._72_24_;
    auVar11 = in_stack_fffffffffffffe40._128_24_;
    params.cParams.targetLength = in_stack_fffffffffffffe40._0_4_;
    params.cParams.strategy = in_stack_fffffffffffffe40._4_4_;
    params.fParams.contentSizeFlag = auVar9._0_4_;
    params.fParams.checksumFlag = auVar9._4_4_;
    params.fParams.noDictIDFlag = auVar9._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe40._20_4_;
    params.forceWindow = in_stack_fffffffffffffe40._24_4_;
    params._52_4_ = in_stack_fffffffffffffe40._28_4_;
    params.targetCBlockSize = in_stack_fffffffffffffe40._32_8_;
    params.srcSizeHint = in_stack_fffffffffffffe40._40_4_;
    params.attachDictPref = in_stack_fffffffffffffe40._44_4_;
    params.literalCompressionMode = in_stack_fffffffffffffe40._48_4_;
    params.nbWorkers = in_stack_fffffffffffffe40._52_4_;
    params.jobSize = in_stack_fffffffffffffe40._56_8_;
    params.overlapLog = in_stack_fffffffffffffe40._64_4_;
    params.rsyncable = in_stack_fffffffffffffe40._68_4_;
    params.ldmParams.enableLdm = auVar10._0_4_;
    params.ldmParams.hashLog = auVar10._4_4_;
    params.ldmParams.bucketSizeLog = auVar10._8_4_;
    params.ldmParams.minMatchLength = auVar10._12_4_;
    params.ldmParams.hashRateLog = auVar10._16_4_;
    params.ldmParams.windowLog = auVar10._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffe40._96_4_;
    params.inBufferMode = in_stack_fffffffffffffe40._100_4_;
    params.outBufferMode = in_stack_fffffffffffffe40._104_4_;
    params.blockDelimiters = in_stack_fffffffffffffe40._108_4_;
    params.validateSequences = in_stack_fffffffffffffe40._112_4_;
    params.splitBlocks = in_stack_fffffffffffffe40._116_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffe40._120_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffe40._124_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar11._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar11._8_8_;
    params.customMem.opaque = (void *)auVar11._16_8_;
    sVar2 = ZSTD_initCDict_internal(cdict,local_e8,dictSize,dictLoadMethod,dictContentType,params);
    if (sVar2 < 0xffffffffffffff89) {
      return cdict;
    }
    ZSTD_freeCDict(cdict);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTDLIB_API ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}